

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O1

void operator_decay(op_type_conflict *op_pt)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  dVar1 = op_pt->sustain_level;
  if (dVar1 < op_pt->amp) {
    op_pt->amp = op_pt->amp * op_pt->decaymul;
  }
  uVar2 = op_pt->generator_pos;
  if (0xffff < uVar2) {
    uVar4 = uVar2 >> 0x10;
    uVar3 = op_pt->cur_env_step;
    do {
      uVar3 = uVar3 + 1;
      if ((op_pt->env_step_d & uVar3) == 0) {
        if (op_pt->amp <= dVar1) {
          if (op_pt->sus_keep == true) {
            op_pt->op_state = 3;
            op_pt->amp = dVar1;
          }
          else {
            op_pt->op_state = 4;
          }
        }
        op_pt->step_amp = op_pt->amp;
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    op_pt->cur_env_step = op_pt->cur_env_step + (uVar2 >> 0x10);
  }
  op_pt->generator_pos = uVar2 & 0xffff;
  return;
}

Assistant:

static void operator_decay(op_type* op_pt)
{
	Bit32u num_steps_add;
	Bit32u ct;
	
	if (op_pt->amp > op_pt->sustain_level)
	{
		// decay phase
		op_pt->amp *= op_pt->decaymul;
	}

	num_steps_add = op_pt->generator_pos/FIXEDPT;	// number of (standardized) samples
	for (ct=0; ct<num_steps_add; ct++)
	{
		op_pt->cur_env_step++;
		if ((op_pt->cur_env_step & op_pt->env_step_d)==0)
		{
			if (op_pt->amp <= op_pt->sustain_level)
			{
				// decay phase finished, sustain level reached
				if (op_pt->sus_keep)
				{
					// keep sustain level (until turned off)
					op_pt->op_state = OF_TYPE_SUS;
					op_pt->amp = op_pt->sustain_level;
				}
				else
				{
					// next: release phase
					op_pt->op_state = OF_TYPE_SUS_NOKEEP;
				}
			}
			op_pt->step_amp = op_pt->amp;
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}